

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeBlockReturn
          (SimplifyLocals<true,_true,_true> *this,Block *block)

{
  size_t *this_00;
  ExpressionList *this_01;
  LocalSet *pLVar1;
  undefined8 *puVar2;
  Block *this_02;
  SimplifyLocals<true,_true,_true> *pSVar3;
  bool bVar4;
  Nop *output;
  size_type sVar5;
  mapped_type *pmVar6;
  Break *pBVar7;
  size_type sVar8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  LocalSet *pLVar11;
  Expression **ppEVar12;
  Expression **ppEVar13;
  Type TVar14;
  Expression *pEVar15;
  Drop *pDVar16;
  _Rb_tree_node_base *p_Var17;
  long lVar18;
  ulong uVar19;
  Name *__x;
  Nop *output_1;
  optional<wasm::Type> type_;
  undefined1 local_360 [8];
  EffectAnalyzer value;
  EffectAnalyzer condition;
  Nop nop;
  FindAll<wasm::LocalSet> findAll;
  Block *local_70;
  Block *block_local;
  _Rb_tree_node_base *local_60;
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  local_58;
  SimplifyLocals<true,_true,_true> *local_40;
  _Rb_tree_color local_34 [2];
  Index sharedIndex;
  
  if ((block->name).super_IString.str._M_str == (char *)0x0) {
    return;
  }
  __x = &block->name;
  local_70 = block;
  sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->unoptimizableBlocks,__x);
  if (sVar5 != 0) {
    return;
  }
  local_40 = this;
  pmVar6 = std::
           map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
           ::operator[](&this->blockBreaks,__x);
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pmVar6->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pmVar6->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar6->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar6->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar6->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar6->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  ::erase(&(this->blockBreaks)._M_t,__x);
  if (local_58.
      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pBVar7 = Expression::cast<wasm::Break>
                       (*(local_58.
                          super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                          ._M_impl.super__Vector_impl_data._M_start)->brp);
    if (pBVar7->value != (Expression *)0x0) {
      __assert_fail("!(*breaks[0].brp)->template cast<Break>()->value",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x205,
                    "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    local_34[0] = ~_S_red;
    block_local = (Block *)&local_40->sinkables;
    local_60 = &(local_40->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var9 = (local_40->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar19 = 0xffffffffffffffff, p_Var9 != local_60;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      lVar18 = 8;
      do {
        uVar19 = uVar19 + 1;
        if ((ulong)(((long)local_58.
                           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.
                          super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar19) {
          local_34[0] = p_Var9[1]._M_color;
          uVar19 = 0;
          goto LAB_00bb33f4;
        }
        sVar8 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::count((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                         *)((long)&(local_58.
                                    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->brp + lVar18),
                        &p_Var9[1]._M_color);
        lVar18 = lVar18 + 0x38;
      } while (sVar8 != 0);
    }
  }
LAB_00bb36f7:
  std::
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ::~vector(&local_58);
  return;
LAB_00bb33f4:
  this_02 = local_70;
  if ((ulong)(((long)local_58.
                     super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar19) goto LAB_00bb3537;
  pmVar10 = std::
            map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
            ::at(&local_58.
                  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar19].sinkables,local_34);
  ppEVar12 = pmVar10->item;
  pBVar7 = Expression::cast<wasm::Break>
                     (*local_58.
                       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].brp);
  pLVar11 = Expression::cast<wasm::LocalSet>(*ppEVar12);
  if (pBVar7->condition != (Expression *)0x0) {
    FindAll<wasm::LocalSet>::FindAll
              ((FindAll<wasm::LocalSet> *)
               &nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type,
               pBVar7->condition);
    pSVar3 = local_40;
    TVar14 = nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type;
    do {
      if ((pointer)TVar14.id ==
          findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
                  ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                   &nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type);
        goto LAB_00bb3527;
      }
      pLVar1 = *(LocalSet **)TVar14.id;
      TVar14.id = (uintptr_t)(TVar14.id + 8);
    } while (pLVar1 != pLVar11);
    condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0x16;
    nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._id = InvalidId;
    nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._1_7_ = 0;
    *ppEVar12 = (Expression *)
                &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)
               &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &((local_40->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                 ).super_Pass.runner)->options,
               (local_40->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .currModule,pBVar7->condition);
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)local_360,
               &((pSVar3->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                 ).super_Pass.runner)->options,
               (pSVar3->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               .currModule,(Expression *)pLVar11);
    *ppEVar12 = (Expression *)pLVar11;
    this_00 = &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    bVar4 = EffectAnalyzer::invalidates((EffectAnalyzer *)this_00,(EffectAnalyzer *)local_360);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_360);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)this_00);
    std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
              ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
               &nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type);
    if (bVar4) goto LAB_00bb36f7;
  }
LAB_00bb3527:
  uVar19 = uVar19 + 1;
  goto LAB_00bb33f4;
LAB_00bb3537:
  if ((local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    this_01 = &local_70->list;
    ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                         (&this_01->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    if ((*ppEVar12)->_id == NopId) {
      pmVar10 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                      *)block_local,local_34);
      ppEVar12 = pmVar10->item;
      pLVar11 = Expression::cast<wasm::LocalSet>(*ppEVar12);
      pEVar15 = pLVar11->value;
      ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&this_01->
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(this_02->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             .usedElements - 1);
      *ppEVar13 = pEVar15;
      pEVar15 = *ppEVar12;
      pEVar15->_id = NopId;
      (pEVar15->type).id = 0;
      p_Var17 = (_Rb_tree_node_base *)0x8;
      for (uVar19 = 0; pSVar3 = local_40,
          uVar19 < (ulong)(((long)local_58.
                                  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_58.
                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x38);
          uVar19 = uVar19 + 1) {
        pmVar10 = std::
                  map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                  ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                        *)((long)&((_Rb_tree_node_base *)&p_Var17->_M_color)->_M_color +
                          (long)&(local_58.
                                  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->brp),local_34);
        ppEVar12 = pmVar10->item;
        puVar2 = *(undefined8 **)
                  ((long)&local_58.
                          super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].sinkables._M_t._M_impl.
                          super__Rb_tree_header._M_node_count + (long)p_Var17);
        local_60 = p_Var17;
        pBVar7 = Expression::cast<wasm::Break>((Expression *)*puVar2);
        if (pBVar7->value != (Expression *)0x0) {
          __assert_fail("!br->value",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x25d,
                        "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
        pLVar11 = Expression::cast<wasm::LocalSet>(*ppEVar12);
        if (pBVar7->condition == (Expression *)0x0) {
          pBVar7->value = pLVar11->value;
          (pLVar11->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = NopId;
          (pLVar11->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
        }
        else {
          pBVar7->value = (Expression *)pLVar11;
          TVar14 = Function::getLocalType
                             ((local_40->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              .currFunction,pLVar11->index);
          LocalSet::makeTee(pLVar11,TVar14);
          pEVar15 = (Expression *)
                    MixedArena::alloc<wasm::Nop>
                              (&((local_40->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                .currModule)->allocator);
          *ppEVar12 = pEVar15;
          Break::finalize(pBVar7);
          value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)(local_40->
                       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                       ).
                       super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       .
                       super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       .
                       super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       .currModule;
          pDVar16 = Builder::makeDrop((Builder *)
                                      &value.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,(Expression *)pBVar7);
          *puVar2 = pDVar16;
        }
        p_Var17 = (_Rb_tree_node_base *)&local_60[1]._M_right;
      }
      value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)(local_40->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                   .
                   super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                   .
                   super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                   .currModule;
      pLVar11 = Builder::makeLocalSet
                          ((Builder *)
                           &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           local_34[0],(Expression *)this_02);
      Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        *)&(pSVar3->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                       ,(Expression *)pLVar11);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
      ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
               *)block_local);
      local_40->anotherCycle = true;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pLVar11;
      Block::finalize(this_02,type_,Unknown);
      goto LAB_00bb36f7;
    }
  }
  std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
            (&local_40->blocksToEnlarge,&local_70);
  goto LAB_00bb36f7;
}

Assistant:

void optimizeBlockReturn(Block* block) {
    if (!block->name.is() || unoptimizableBlocks.count(block->name) > 0) {
      return;
    }
    auto breaks = std::move(blockBreaks[block->name]);
    blockBreaks.erase(block->name);
    if (breaks.size() == 0) {
      // block has no branches TODO we might optimize trivial stuff here too
      return;
    }
    // block does not already have a return value (if one break has one, they
    // all do)
    assert(!(*breaks[0].brp)->template cast<Break>()->value);
    // look for a local.set that is present in them all
    bool found = false;
    Index sharedIndex = -1;
    for (auto& [index, _] : sinkables) {
      bool inAll = true;
      for (size_t j = 0; j < breaks.size(); j++) {
        if (breaks[j].sinkables.count(index) == 0) {
          inAll = false;
          break;
        }
      }
      if (inAll) {
        sharedIndex = index;
        found = true;
        break;
      }
    }
    if (!found) {
      return;
    }
    // If one of our brs is a br_if, then we will give it a value. since
    // the value executes before the condition, it is dangerous if we are
    // moving code out of the condition,
    //  (br_if
    //   (block
    //    ..use $x..
    //    (local.set $x ..)
    //   )
    //  )
    // =>
    //  (br_if
    //   (local.tee $x ..) ;; this now affects the use!
    //   (block
    //    ..use $x..
    //   )
    //  )
    // so we must check for that.
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        // TODO: optimize
        FindAll<LocalSet> findAll(br->condition);
        for (auto* otherSet : findAll.list) {
          if (otherSet == set) {
            // the set is indeed in the condition, so we can't just move it
            // but maybe there are no effects? see if, ignoring the set
            // itself, there is any risk
            Nop nop;
            *breakLocalSetPointer = &nop;
            EffectAnalyzer condition(
              this->getPassOptions(), *this->getModule(), br->condition);
            EffectAnalyzer value(
              this->getPassOptions(), *this->getModule(), set);
            *breakLocalSetPointer = set;
            if (condition.invalidates(value)) {
              // indeed, we can't do this, stop
              return;
            }
            break; // we found set in the list, can stop now
          }
        }
      }
    }
    // Great, this local is set in them all, we can optimize!
    if (block->list.size() == 0 || !block->list.back()->is<Nop>()) {
      // We can't do this here, since we can't push to the block -
      // it would invalidate sinkable pointers. So we queue a request
      // to grow the block at the end of the turn, we'll get this next
      // cycle.
      blocksToEnlarge.push_back(block);
      return;
    }
    // move block local.set's value to the end, in return position, and nop the
    // set
    auto* blockLocalSetPointer = sinkables.at(sharedIndex).item;
    auto* value = (*blockLocalSetPointer)->template cast<LocalSet>()->value;
    block->list[block->list.size() - 1] = value;
    ExpressionManipulator::nop(*blockLocalSetPointer);
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      assert(!br->value);
      // if the break is conditional, then we must set the value here - if the
      // break is not reached, we must still have the new value in the local
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        br->value = set;
        set->makeTee(this->getFunction()->getLocalType(set->index));
        *breakLocalSetPointer =
          this->getModule()->allocator.template alloc<Nop>();
        // in addition, as this is a conditional br that now has a value, it now
        // returns a value, so it must be dropped
        br->finalize();
        *brp = Builder(*this->getModule()).makeDrop(br);
      } else {
        br->value = set->value;
        ExpressionManipulator::nop(set);
      }
    }
    // finally, create a local.set on the block itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(sharedIndex, block);
    this->replaceCurrent(newLocalSet);
    sinkables.clear();
    anotherCycle = true;
    block->finalize();
  }